

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.cpp
# Opt level: O2

idx_t duckdb::CreateTreeRecursive<duckdb::ProfilingNode>
                (RenderTree *result,ProfilingNode *op,idx_t x,idx_t y)

{
  ProfilingInfo *this;
  double params;
  bool bVar1;
  pointer pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  mapped_type *this_00;
  idx_t iVar4;
  unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true> node;
  allocator local_151;
  unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_> local_150;
  unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_> local_148;
  idx_t y_local;
  idx_t x_local;
  string cardinality;
  string local_108;
  idx_t width;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extra_info;
  string local_50;
  
  this = &op->profiling_info;
  extra_info.map_idx._M_h._M_buckets = &extra_info.map_idx._M_h._M_single_bucket;
  extra_info.map.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extra_info.map.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extra_info.map.
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  extra_info.map_idx._M_h._M_bucket_count = 1;
  extra_info.map_idx._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  extra_info.map_idx._M_h._M_element_count = 0;
  extra_info.map_idx._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  extra_info.map_idx._M_h._M_rehash_policy._M_next_resize = 0;
  extra_info.map_idx._M_h._M_single_bucket = (__node_base_ptr)0x0;
  y_local = y;
  x_local = x;
  bVar1 = ProfilingInfo::Enabled(&this->settings,EXTRA_INFO);
  if (bVar1) {
    InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(&extra_info,&(op->profiling_info).extra_info);
  }
  ::std::__cxx11::string::string((string *)&width,"QUERY",(allocator *)&cardinality);
  if (op->depth != 0) {
    ProfilingInfo::GetMetricAsString_abi_cxx11_((string *)&cardinality,this,OPERATOR_TYPE);
    ::std::__cxx11::string::operator=((string *)&width,(string *)&cardinality);
    ::std::__cxx11::string::~string((string *)&cardinality);
  }
  make_uniq<duckdb::RenderTreeNode,std::__cxx11::string&,duckdb::InsertionOrderPreservingMap<std::__cxx11::string>&>
            ((duckdb *)&node,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&width,&extra_info
            );
  bVar1 = ProfilingInfo::Enabled(&this->settings,OPERATOR_CARDINALITY);
  if (bVar1) {
    ProfilingInfo::GetMetricAsString_abi_cxx11_((string *)&cardinality,this,OPERATOR_CARDINALITY);
    pRVar2 = unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>::
             operator->(&node);
    ::std::__cxx11::string::string((string *)&local_108,"__cardinality__",(allocator *)&local_c8);
    pbVar3 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&pRVar2->extra_text,&local_108);
    ::std::__cxx11::string::_M_assign((string *)pbVar3);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::__cxx11::string::~string((string *)&cardinality);
  }
  bVar1 = ProfilingInfo::Enabled(&this->settings,OPERATOR_TIMING);
  if (bVar1) {
    cardinality._M_dataplus._M_p._0_1_ = 9;
    this_00 = std::__detail::
              _Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::at((_Map_base<duckdb::MetricsType,_std::pair<const_duckdb::MetricsType,_duckdb::Value>,_std::allocator<std::pair<const_duckdb::MetricsType,_duckdb::Value>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    *)&(op->profiling_info).metrics,(key_type *)&cardinality);
    params = Value::GetValue<double>(this_00);
    ::std::__cxx11::string::string((string *)&local_108,"%.2f",(allocator *)&local_c8);
    Exception::ConstructMessage<double>((string *)&cardinality,&local_108,params);
    ::std::__cxx11::string::~string((string *)&local_108);
    ::std::operator+(&local_c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cardinality,"s");
    pRVar2 = unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>::
             operator->(&node);
    ::std::__cxx11::string::string((string *)&local_50,"__timing__",&local_151);
    pbVar3 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](&pRVar2->extra_text,&local_50);
    ::std::__cxx11::string::operator=((string *)pbVar3,(string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_c8);
    ::std::__cxx11::string::~string((string *)&cardinality);
  }
  ::std::__cxx11::string::~string((string *)&width);
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~InsertionOrderPreservingMap(&extra_info);
  if ((op->children).
      super_vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (op->children).
      super_vector<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ProfilingNode,_std::default_delete<duckdb::ProfilingNode>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_148._M_t.
    super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>.
    super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
          )(__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
            )node.
             super_unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>
             .super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl;
    node.super_unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>.
    super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl =
         (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>)
         (__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
          )0x0;
    RenderTree::SetNode(result,x,y,
                        (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
                         *)&local_148);
    ::std::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>::
    ~unique_ptr(&local_148);
    iVar4 = 1;
  }
  else {
    width = 0;
    extra_info.map.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    extra_info.map_idx._M_h._M_buckets = (__buckets_ptr)0x0;
    extra_info.map.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extra_info.map.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    extra_info.map.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x28);
    ((extra_info.map.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p = (pointer)&x_local;
    ((extra_info.map.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->first)._M_string_length = (size_type)&width;
    ((extra_info.map.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->first).field_2._M_allocated_capacity =
         (size_type)&y_local;
    *(unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true> **)
     ((long)&((extra_info.map.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first).field_2 + 8) = &node;
    ((extra_info.map.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->second)._M_dataplus._M_p = (pointer)result;
    extra_info.map_idx._M_h._M_buckets =
         (__buckets_ptr)
         std::
         _Function_handler<void_(const_duckdb::ProfilingNode_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:137:39)>
         ::_M_invoke;
    extra_info.map.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  _Function_handler<void_(const_duckdb::ProfilingNode_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/common/render_tree.cpp:137:39)>
                  ::_M_manager;
    anon_unknown.dwarf_20e7f4a::TreeChildrenIterator::Iterate<duckdb::ProfilingNode>
              (op,(function<void_(const_duckdb::ProfilingNode_&)> *)&extra_info);
    ::std::_Function_base::~_Function_base((_Function_base *)&extra_info);
    local_150._M_t.
    super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>._M_t
    .super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>.
    super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
          )(__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
            )node.
             super_unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>.
             _M_t.
             super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>
             .super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl;
    node.super_unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>._M_t
    .super___uniq_ptr_impl<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::RenderTreeNode_*,_std::default_delete<duckdb::RenderTreeNode>_>.
    super__Head_base<0UL,_duckdb::RenderTreeNode_*,_false>._M_head_impl =
         (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>)
         (__uniq_ptr_data<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true,_true>
          )0x0;
    RenderTree::SetNode(result,x_local,y_local,
                        (unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>,_true>
                         *)&local_150);
    ::std::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>::
    ~unique_ptr(&local_150);
    iVar4 = width;
  }
  ::std::unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>::
  ~unique_ptr(&node.
               super_unique_ptr<duckdb::RenderTreeNode,_std::default_delete<duckdb::RenderTreeNode>_>
             );
  return iVar4;
}

Assistant:

static idx_t CreateTreeRecursive(RenderTree &result, const T &op, idx_t x, idx_t y) {
	auto node = CreateNode(op);

	if (!TreeChildrenIterator::HasChildren(op)) {
		result.SetNode(x, y, std::move(node));
		return 1;
	}
	idx_t width = 0;
	// render the children of this node
	TreeChildrenIterator::Iterate<T>(op, [&](const T &child) {
		auto child_x = x + width;
		auto child_y = y + 1;
		node->AddChildPosition(child_x, child_y);
		width += CreateTreeRecursive<T>(result, child, child_x, child_y);
	});
	result.SetNode(x, y, std::move(node));
	return width;
}